

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O2

void __thiscall
HEkkDualRHS::chooseMultiGlobal
          (HEkkDualRHS *this,HighsInt *chIndex,HighsInt *chCount,HighsInt chLimit)

{
  double dVar1;
  double dVar2;
  HighsInt sup;
  HEkk *pHVar3;
  HighsInt *pHVar4;
  int iVar5;
  HighsInt HVar6;
  ulong uVar7;
  size_type __new_size;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  undefined8 uVar15;
  HighsInt local_a0;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> setP;
  pair<double,_int> local_68;
  double local_58;
  undefined8 uStack_50;
  ulong local_48;
  HighsInt *local_40;
  HighsInt *local_38;
  
  uVar11 = (ulong)(uint)chLimit;
  uVar13 = 0;
  local_40 = chCount;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x26,0);
  uVar7 = 0;
  if (0 < chLimit) {
    uVar7 = (ulong)(uint)chLimit;
  }
  for (; uVar7 != uVar13; uVar13 = uVar13 + 1) {
    chIndex[uVar13] = -1;
  }
  uVar7 = (ulong)(uint)(chLimit * 2);
  setP.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  setP.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  setP.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::reserve
            (&setP,uVar7);
  pHVar3 = this->ekk_instance_;
  sup = this->workCount;
  __new_size = (size_type)chLimit;
  local_48 = uVar11;
  local_38 = chIndex;
  if (sup < 0) {
    HVar6 = HighsRandom::integer(&pHVar3->random_,-sup);
    dVar14 = 0.0;
    uVar15 = 0;
    for (iVar9 = 0; iVar9 != 2; iVar9 = iVar9 + 1) {
      iVar8 = HVar6;
      iVar5 = 0;
      if (iVar9 == 0) {
        iVar8 = -sup;
        iVar5 = HVar6;
      }
      for (lVar12 = (long)iVar5; lVar12 < iVar8; lVar12 = lVar12 + 1) {
        dVar1 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar12];
        if ((1e-50 < dVar1) &&
           (dVar2 = (pHVar3->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar12], dVar14 * dVar2 < dVar1)) {
          local_68.first = -dVar1 / dVar2;
          local_68.second = (int)lVar12;
          local_58 = dVar14;
          uStack_50 = uVar15;
          std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
          emplace_back<std::pair<double,int>>
                    ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)&setP,
                     &local_68);
          dVar14 = local_58;
          uVar15 = uStack_50;
          if (uVar7 <= (ulong)((long)setP.
                                     super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)setP.
                                     super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4)) {
            pdqsort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
                      ();
            std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
                      (&setP,__new_size);
            uVar15 = 0x8000000000000000;
            dVar14 = -setP.
                      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].first;
          }
        }
      }
    }
  }
  else {
    local_a0 = 0;
    if (sup != 0) {
      local_a0 = HighsRandom::integer(&pHVar3->random_,sup);
    }
    dVar14 = 0.0;
    uVar15 = 0;
    for (iVar9 = 0; iVar9 != 2; iVar9 = iVar9 + 1) {
      iVar8 = local_a0;
      iVar5 = 0;
      if (iVar9 == 0) {
        iVar8 = this->workCount;
        iVar5 = local_a0;
      }
      for (lVar12 = (long)iVar5; lVar12 < iVar8; lVar12 = lVar12 + 1) {
        iVar5 = (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar12];
        dVar1 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar5];
        if ((1e-50 < dVar1) &&
           (dVar2 = (pHVar3->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar5], dVar14 * dVar2 < dVar1)) {
          local_68.first = -dVar1 / dVar2;
          local_68.second = iVar5;
          local_58 = dVar14;
          uStack_50 = uVar15;
          std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
          emplace_back<std::pair<double,int>>
                    ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)&setP,
                     &local_68);
          dVar14 = local_58;
          uVar15 = uStack_50;
          if (uVar7 <= (ulong)((long)setP.
                                     super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)setP.
                                     super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4)) {
            pdqsort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
                      ();
            std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
                      (&setP,__new_size);
            uVar15 = 0x8000000000000000;
            dVar14 = -setP.
                      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].first;
          }
        }
      }
    }
  }
  pdqsort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
            (setP.
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             setP.
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  pHVar4 = local_38;
  uVar7 = (long)setP.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)setP.
                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if ((int)local_48 < (int)(uVar7 >> 4)) {
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
              (&setP,__new_size);
    uVar7 = (long)setP.
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)setP.
                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  }
  *local_40 = (HighsInt)((long)uVar7 >> 4);
  for (uVar10 = 0; uVar11 = (ulong)uVar10, uVar11 < (ulong)((long)uVar7 >> 4); uVar10 = uVar10 + 1)
  {
    pHVar4[uVar11] =
         setP.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar11].second;
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x26,0);
  std::_Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::~_Vector_base
            (&setP.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>);
  return;
}

Assistant:

void HEkkDualRHS::chooseMultiGlobal(HighsInt* chIndex, HighsInt* chCount,
                                    HighsInt chLimit) {
  analysis->simplexTimerStart(ChuzrDualClock);

  for (HighsInt i = 0; i < chLimit; i++) chIndex[i] = -1;

  const HighsUInt chooseCHECK = chLimit * 2;
  vector<pair<double, int>> setP;
  setP.reserve(chooseCHECK);

  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (workCount < 0) {
    // DENSE mode
    const HighsInt numRow = -workCount;
    HighsInt randomStart = ekk_instance_.random_.integer(numRow);
    double cutoffMerit = 0;
    // Now
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? numRow : randomStart;
      for (HighsInt iRow = start; iRow < end; iRow++) {
        // Was
        //    for (HighsInt iRow = 0; iRow < numRow; iRow++) {
        // Continue
        if (work_infeasibility[iRow] > kHighsZero) {
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          if (cutoffMerit * myWeight < myInfeas) {
            // Save
            setP.push_back(make_pair(-myInfeas / myWeight, iRow));
            // Shrink
            if (setP.size() >= chooseCHECK) {
              pdqsort(setP.begin(), setP.end());
              setP.resize(chLimit);
              cutoffMerit = -setP.back().first;
            }
          }
        }
      }
    }
  } else {
    // SPARSE Mode
    HighsInt randomStart;
    if (workCount) {
      randomStart = ekk_instance_.random_.integer(workCount);
    } else {
      // workCount = 0
      randomStart = 0;
    }
    double cutoffMerit = 0;
    // Now
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? workCount : randomStart;
      for (HighsInt i = start; i < end; i++) {
        // Was
        //    for (HighsInt i = 0; i < workCount; i++) {
        // Continue
        HighsInt iRow = workIndex[i];
        if (work_infeasibility[iRow] > kHighsZero) {
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          /*
          const double myMerit = myInfeas / myWeight;
          printf("CHUZR: iRow = %6" HIGHSINT_FORMAT "; Infeas = %11.4g; Weight =
          %11.4g; Merit = %11.4g\n", iRow, myInfeas, myWeight, myMerit);
          */
          if (cutoffMerit * myWeight < myInfeas) {
            // Save
            setP.push_back(make_pair(-myInfeas / myWeight, iRow));
            // Shrink
            if (setP.size() >= chooseCHECK) {
              pdqsort(setP.begin(), setP.end());
              setP.resize(chLimit);
              cutoffMerit = -setP.back().first;
            }
          }
        }
      }
    }
  }

  // Store the setP
  pdqsort(setP.begin(), setP.end());
  if ((HighsInt)(setP.size()) > chLimit) setP.resize(chLimit);
  *chCount = setP.size();
  for (unsigned i = 0; i < setP.size(); i++) chIndex[i] = setP[i].second;
  analysis->simplexTimerStop(ChuzrDualClock);
}